

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O3

word zzAdd3(word *c,word *a,size_t n,word *b,size_t m)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  word wVar5;
  ulong uVar6;
  
  if (n < m || n - m == 0) {
    if (n < m) {
      wwCopy(c + n,b + n,m - n);
      if (n == 0) {
        wVar5 = 0;
      }
      else {
        sVar4 = 0;
        wVar5 = 0;
        do {
          uVar2 = a[sVar4];
          uVar6 = wVar5 + a[sVar4];
          uVar3 = b[sVar4];
          c[sVar4] = uVar6 + b[sVar4];
          wVar5 = (word)(CARRY8(uVar6,uVar3) || CARRY8(wVar5,uVar2));
          sVar4 = sVar4 + 1;
        } while (n != sVar4);
      }
      do {
        puVar1 = c + n;
        uVar2 = *puVar1;
        *puVar1 = *puVar1 + wVar5;
        wVar5 = (word)CARRY8(uVar2,wVar5);
        n = n + 1;
      } while (m != n);
    }
    else if (n == 0) {
      wVar5 = 0;
    }
    else {
      sVar4 = 0;
      wVar5 = 0;
      do {
        uVar2 = a[sVar4];
        uVar6 = wVar5 + a[sVar4];
        uVar3 = b[sVar4];
        c[sVar4] = uVar6 + b[sVar4];
        wVar5 = (word)(CARRY8(uVar6,uVar3) || CARRY8(wVar5,uVar2));
        sVar4 = sVar4 + 1;
      } while (n != sVar4);
    }
  }
  else {
    wwCopy(c + m,a + m,n - m);
    if (m == 0) {
      wVar5 = 0;
    }
    else {
      sVar4 = 0;
      wVar5 = 0;
      do {
        uVar2 = a[sVar4];
        uVar6 = wVar5 + a[sVar4];
        uVar3 = b[sVar4];
        c[sVar4] = uVar6 + b[sVar4];
        wVar5 = (word)(CARRY8(uVar6,uVar3) || CARRY8(wVar5,uVar2));
        sVar4 = sVar4 + 1;
      } while (m != sVar4);
    }
    do {
      puVar1 = c + m;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + wVar5;
      wVar5 = (word)CARRY8(uVar2,wVar5);
      m = m + 1;
    } while (n != m);
  }
  return wVar5;
}

Assistant:

word zzAdd3(word c[], const word a[], size_t n, const word b[], size_t m)
{
	if (n > m)
	{
		wwCopy(c + m, a + m, n - m);
		return zzAddW2(c + m, n - m, zzAdd(c, a, b, m));
	}
	if (n < m)
	{
		wwCopy(c + n, b + n, m - n);
		return zzAddW2(c + n, m - n, zzAdd(c, a, b, n));
	}
	return zzAdd(c, a, b, n);
}